

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.cpp
# Opt level: O0

int __thiscall cali::Attribute::properties(Attribute *this)

{
  int iVar1;
  cali_id_t cVar2;
  cali_variant_t local_30;
  Node *local_20;
  Node *node;
  Attribute *this_local;
  
  local_20 = this->m_node;
  node = (Node *)this;
  while( true ) {
    if (local_20 == (Node *)0x0) {
      return 0;
    }
    cVar2 = Node::attribute(local_20);
    if (cVar2 == 10) break;
    local_20 = util::LockfreeIntrusiveTree<cali::Node>::parent
                         (&local_20->super_LockfreeIntrusiveTree<cali::Node>);
  }
  local_30 = (cali_variant_t)Node::data(local_20);
  iVar1 = Variant::to_int((Variant *)&local_30,(bool *)0x0);
  return iVar1;
}

Assistant:

int Attribute::properties() const
{
    for (const Node* node = m_node; node; node = node->parent())
        if (node->attribute() == PROP_ATTR_ID)
            return node->data().to_int();

    return CALI_ATTR_DEFAULT;
}